

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O1

void llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode
               (FileInfo *value,BinaryDecoder *coder)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int i;
  long lVar4;
  
  uVar2 = BinaryDecoder::read32(coder);
  uVar3 = BinaryDecoder::read32(coder);
  value->device = CONCAT44(uVar3,uVar2);
  uVar2 = BinaryDecoder::read32(coder);
  uVar3 = BinaryDecoder::read32(coder);
  value->inode = CONCAT44(uVar3,uVar2);
  uVar2 = BinaryDecoder::read32(coder);
  uVar3 = BinaryDecoder::read32(coder);
  value->mode = CONCAT44(uVar3,uVar2);
  uVar2 = BinaryDecoder::read32(coder);
  uVar3 = BinaryDecoder::read32(coder);
  value->size = CONCAT44(uVar3,uVar2);
  BinaryDecoder::read<llbuild::basic::FileTimestamp>(coder,&value->modTime);
  lVar4 = 0;
  do {
    uVar1 = BinaryDecoder::read8(coder);
    (value->checksum).bytes[lVar4] = uVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  return;
}

Assistant:

static inline void decode(FileInfo& value, BinaryDecoder& coder) {
    coder.read(value.device);
    coder.read(value.inode);
    coder.read(value.mode);
    coder.read(value.size);
    coder.read(value.modTime);
    coder.read(value.checksum);
  }